

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_9a1342::TestSignatureChecker::CheckECDSASignature
          (TestSignatureChecker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey,CScript *scriptcode,
          SigVersion sigversion)

{
  bool bVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  CPubKey pk;
  CPubKey local_59;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::Set<unsigned_char_const*>
            (&local_59,
             (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  if ((local_59.vch[0] & 0xfe) != 2) {
    bVar1 = false;
    if ((7 < local_59.vch[0]) || (bVar1 = false, (0xd0U >> (local_59.vch[0] & 0x1f) & 1) == 0))
    goto LAB_003bb991;
  }
  cVar2 = std::
          _Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)((anonymous_namespace)::g_testdata + 0xa8),&local_59);
  if (cVar2._M_node == (_Base_ptr)((anonymous_namespace)::g_testdata + 0xb0)) {
    bVar1 = false;
  }
  else {
    bVar1 = std::operator==(sig,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &cVar2._M_node[3]._M_parent);
  }
LAB_003bb991:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckECDSASignature(const std::vector<unsigned char>& sig, const std::vector<unsigned char>& pubkey, const CScript& scriptcode, SigVersion sigversion) const override {
        CPubKey pk(pubkey);
        if (!pk.IsValid()) return false;
        // Instead of actually running signature validation, check if the signature matches the precomputed one for this key.
        auto it = g_testdata->signatures.find(pk);
        if (it == g_testdata->signatures.end()) return false;
        return sig == it->second;
    }